

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::Stop(SoundSystemFMOD *this,uint64_t sndId)

{
  FMOD_RESULT _r;
  SoundChannel *pSVar1;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  FmodError local_70;
  
  pSVar1 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if (pSVar1 != (SoundChannel *)0x0) {
    if (pSVar1->pChn == (FMOD_CHANNEL *)0x0) {
      SoundSystem::RemoveChn(&this->super_SoundSystem,sndId);
      return;
    }
    gFmodRes = FMOD_Channel_Stop();
    if (gFmodRes != FMOD_OK) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"FMOD_Channel_Stop(pChn->pChn)",&local_d1);
      _r = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_d2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Stop",&local_d3);
      FmodError::FmodError(&local_70,&local_90,_r,&local_b0,0x162,&local_d0);
      FmodError::LogErr(&local_70);
      FmodError::~FmodError(&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::Stop (uint64_t sndId)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn) return;
    
    // Stop the channel, will trigger callback, which will remove the sound from tracking
    if (pChn->pChn) {
        FMOD_LOG(FMOD_Channel_Stop(pChn->pChn));
    } else {
        RemoveChn(sndId);
    }
}